

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  Random *this_00;
  bool bVar1;
  Shareability share;
  BasicHeapType BVar2;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *__x;
  iterator iVar3;
  value_type *pvVar4;
  FeatureOptions<wasm::HeapType> *pFVar5;
  HeapType first;
  HeapType *this_01;
  HeapType HStackY_b0;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_98;
  undefined1 auStack_68 [8];
  FeatureOptions<wasm::HeapType> options;
  HeapType local_30;
  HeapType type_local;
  
  this_00 = &this->random;
  local_30.id = type.id;
  bVar1 = Random::oneIn(this_00,3);
  if (bVar1) {
    return (HeapType)type.id;
  }
  if ((0x7c < type.id) || (bVar1 = Random::oneIn(this_00,2), !bVar1)) {
switchD_00146f9c_default:
    iVar3 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->interestingHeapSubTypes)._M_h,&local_30);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      return (HeapType)local_30.id;
    }
    if (*(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x10) ==
        *(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x18)) {
      return (HeapType)local_30.id;
    }
    pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                ((long)iVar3.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                                       ._M_cur + 0x10));
    return (HeapType)pvVar4->id;
  }
  share = wasm::HeapType::getShared();
  BVar2 = HeapType::getBasic(&local_30,Unshared);
  switch(BVar2 << 0x1d | BVar2 - ext >> 3) {
  case 0:
    if (((byte)this->wasm[0x179] & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1557,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add
                       ((FeatureOptions<wasm::HeapType> *)&local_98,(HeapType)0x8);
    __x = (_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
           *)Random::FeatureOptions<wasm::HeapType>::add<>(pFVar5,(FeatureSet)0x400,(HeapType)0x60);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                *)auStack_68,__x);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree(&local_98);
    if (share == Unshared) {
      Random::FeatureOptions<wasm::HeapType>::add<>
                ((FeatureOptions<wasm::HeapType> *)auStack_68,(FeatureSet)0x4000,(HeapType)0x50);
    }
    local_98._M_impl._0_8_ =
         Random::pick<wasm::HeapType>(this_00,(FeatureOptions<wasm::HeapType> *)auStack_68);
    goto LAB_0014715f;
  case 1:
    if (((byte)this->wasm[0x179] & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x154f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&options;
    auStack_68 = (undefined1  [8])0x0;
    options.options._M_t._M_impl._0_8_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add
                       ((FeatureOptions<wasm::HeapType> *)auStack_68,(HeapType)0x10);
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar5,(FeatureSet)0x400,(HeapType)0x68);
    local_98._M_impl._0_8_ = Random::pick<wasm::HeapType>(this_00,pFVar5);
LAB_0014715f:
    BVar2 = HeapType::getBasic((HeapType *)&local_98,share);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                 *)auStack_68);
    return (HeapType)(ulong)BVar2;
  case 2:
    first.id = 0x18;
    HStackY_b0.id = 0x70;
    goto LAB_00147186;
  case 3:
    if ((*(uint *)(this->wasm + 0x178) >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1562,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((*(uint *)(this->wasm + 0x178) >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1563,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    auStack_68 = (undefined1  [8])
                 Random::
                 pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                           (this_00,(HeapType)0x20,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,
                            (HeapType)0x40,(HeapType)0x58);
    goto LAB_0014718f;
  case 4:
    if ((*(uint *)(this->wasm + 0x178) >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x156d,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((*(uint *)(this->wasm + 0x178) >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x156e,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    auStack_68 = (undefined1  [8])
                 Random::
                 pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                           (this_00,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,(HeapType)0x40,
                            (HeapType)0x58);
    goto LAB_0014718f;
  case 5:
    HStackY_b0.id = 0x30;
    break;
  case 6:
    HStackY_b0.id = 0x38;
    break;
  case 7:
    HStackY_b0.id = 0x40;
    break;
  case ext:
    if (share != Unshared) {
      __assert_fail("share == Unshared",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x157c,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    this_01 = (HeapType *)&HeapTypes::exn;
    share = Unshared;
    goto LAB_00147198;
  case 9:
    if (share == Unshared) {
      return (HeapType)0x50;
    }
    __assert_fail("share == Unshared",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x157f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
  default:
    goto switchD_00146f9c_default;
  }
  first.id = HStackY_b0.id;
  HStackY_b0.id = 0x58;
LAB_00147186:
  auStack_68 = (undefined1  [8])
               Random::pick<wasm::HeapType,wasm::HeapType>(this_00,first,HStackY_b0);
LAB_0014718f:
  this_01 = (HeapType *)auStack_68;
LAB_00147198:
  BVar2 = HeapType::getBasic(this_01,share);
  return (HeapType)(ulong)BVar2;
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    auto share = type.getShared();
    switch (type.getBasic(Unshared)) {
      case HeapType::func:
        // TODO: Typed function references.
        assert(wasm.features.hasReferenceTypes());
        return pick(FeatureOptions<HeapType>()
                      .add(HeapTypes::func)
                      .add(FeatureSet::GC, HeapTypes::nofunc))
          .getBasic(share);
      case HeapType::cont:
        return pick(HeapTypes::cont, HeapTypes::nocont).getBasic(share);
      case HeapType::ext: {
        assert(wasm.features.hasReferenceTypes());
        auto options = FeatureOptions<HeapType>()
                         .add(HeapTypes::ext)
                         .add(FeatureSet::GC, HeapTypes::noext);
        if (share == Unshared) {
          // Shared strings not yet supported.
          options.add(FeatureSet::Strings, HeapType::string);
        }
        return pick(options).getBasic(share);
      }
      case HeapType::any: {
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::any,
                    HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      }
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      case HeapType::i31:
        return pick(HeapTypes::i31, HeapTypes::none).getBasic(share);
      case HeapType::struct_:
        return pick(HeapTypes::struct_, HeapTypes::none).getBasic(share);
      case HeapType::array:
        return pick(HeapTypes::array, HeapTypes::none).getBasic(share);
      case HeapType::exn:
        assert(share == Unshared);
        return HeapTypes::exn.getBasic(share);
      case HeapType::string:
        assert(share == Unshared);
        return HeapType::string;
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}